

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O3

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::TPZFrontMatrix
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *cp)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZBaseMatrix_01986318;
  iVar1 = (cp->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
          fCol;
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
       (cp->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
       iVar1;
  cVar2 = (cp->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
          fDefPositive;
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDecomposed = (cp->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.
                super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDefPositive = cVar2;
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFrontMatrix_01980a90;
  (this->fStorage).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZStackEqnStorage_0198e3a0;
  TPZManVector<TPZEqnArray<double>,_10>::TPZManVector
            (&(this->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<double>,_10>,
             &(cp->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<double>,_10>);
  (this->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<double>,_10>.
  super_TPZVec<TPZEqnArray<double>_>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0198e410;
  TPZFront<double>::TPZFront
            (&(this->fFront).super_TPZFront<double>,&PTR_PTR_0198e590,
             &(cp->fFront).super_TPZFront<double>);
  (this->fFront).super_TPZFront<double>.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFrontSym_0198e518;
  iVar1 = cp->fLastDecomposed;
  this->fNumEq = cp->fNumEq;
  this->fLastDecomposed = iVar1;
  TPZVec<int>::TPZVec(&this->fNumElConnected,&cp->fNumElConnected);
  TPZVec<int>::TPZVec(&this->fNumElConnectedBackup,&cp->fNumElConnectedBackup);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }